

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_PackedSerializationToStream_Test::
TestBody(ExtensionSetTest_PackedSerializationToStream_Test *this)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  char *in_R9;
  pointer *__ptr;
  string_view data_00;
  void *data_1;
  string data;
  ArrayOutputStream array_stream;
  CodedOutputStream output_stream;
  TestPackedExtensions source;
  TestPackedTypes destination;
  AssertHelper local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  AssertHelper local_238;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_230;
  string local_228;
  char *local_208;
  size_t local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  undefined1 local_1e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  undefined1 local_1c8 [48];
  ArrayOutputStream *local_198;
  undefined2 local_190;
  bool local_18e;
  bool local_18d;
  long *local_188;
  int64_t local_180;
  TestPackedExtensions local_178;
  TestPackedTypes local_148;
  
  proto2_unittest::TestPackedExtensions::TestPackedExtensions(&local_178,(Arena *)0x0);
  proto2_unittest::TestPackedTypes::TestPackedTypes(&local_148,(Arena *)0x0);
  TestUtil::SetPackedExtensions<proto2_unittest::TestPackedExtensions>(&local_178);
  sVar4 = proto2_unittest::TestPackedExtensions::ByteSizeLong(&local_178);
  local_200 = 0;
  local_1f8 = '\0';
  local_208 = &local_1f8;
  std::__cxx11::string::resize((ulong)&local_208,(char)sVar4);
  io::ArrayOutputStream::ArrayOutputStream((ArrayOutputStream *)local_1e8,local_208,(int)sVar4,1);
  local_18e = (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
  plVar1 = (long *)(local_1c8 + 0x10);
  local_190._0_1_ = false;
  local_190._1_1_ = false;
  local_18d = false;
  local_1c8._0_8_ = plVar1;
  local_1c8._8_8_ = plVar1;
  local_198 = (ArrayOutputStream *)local_1e8;
  local_188 = plVar1;
  local_180 = io::ArrayOutputStream::ByteCount((ArrayOutputStream *)local_1e8);
  bVar2 = io::ArrayOutputStream::Next
                    ((ArrayOutputStream *)local_1e8,(void **)&local_228,(int *)&local_248);
  if (bVar2 && 0 < (int)(uint)local_248.data_) {
    local_188 = (long *)local_228._M_dataplus._M_p;
    local_1c8._8_8_ = (long *)0x0;
    local_1c8._0_8_ = local_228._M_dataplus._M_p + -0x10;
    if ((uint)local_248.data_ < 0x11) {
      local_188 = plVar1;
      local_1c8._8_8_ = local_228._M_dataplus._M_p;
      local_1c8._0_8_ = plVar1;
    }
    local_1c8._0_8_ = local_1c8._0_8_ + (ulong)(uint)local_248.data_;
  }
  iVar3 = (*local_178.super_Message.super_MessageLite._vptr_MessageLite[5])
                    (&local_178,local_188,local_1c8);
  local_188 = (long *)CONCAT44(extraout_var,iVar3);
  bVar2 = io::CodedOutputStream::HadError((CodedOutputStream *)local_1c8);
  local_248.data_._0_4_ = CONCAT31(local_248.data_._1_3_,!bVar2);
  local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_228,(internal *)&local_248,(AssertionResult *)"output_stream.HadError()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x262,local_228._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if (local_230._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_230._M_head_impl + 8))();
    }
    if (local_240 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_240,local_240);
    }
    io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_1c8);
  }
  else {
    io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_1c8);
    data_00._M_str = local_208;
    data_00._M_len = local_200;
    local_1e8[0] = (internal)MessageLite::ParseFromString((MessageLite *)&local_148,data_00);
    local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_1e8[0]) {
      testing::Message::Message((Message *)&local_228);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1c8,(internal *)local_1e8,
                 (AssertionResult *)"destination.ParseFromString(data)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x264,(char *)local_1c8._0_8_);
      testing::internal::AssertHelper::operator=(&local_248,(Message *)&local_228);
      testing::internal::AssertHelper::~AssertHelper(&local_248);
      if ((long *)local_1c8._0_8_ != plVar1) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
      if ((long *)local_228._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_228._M_dataplus._M_p + 8))();
      }
      if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1e0,local_1e0);
      }
    }
    TestUtil::ExpectPackedFieldsSet<proto2_unittest::TestPackedTypes>(&local_148);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
  }
  proto2_unittest::TestPackedTypes::~TestPackedTypes(&local_148);
  proto2_unittest::TestPackedExtensions::~TestPackedExtensions(&local_178);
  return;
}

Assistant:

TEST(ExtensionSetTest, PackedSerializationToStream) {
  // Serialize as TestPackedExtensions and parse as TestPackedTypes to insure
  // wire compatibility of extensions.
  //
  // This checks serialization to an output stream by creating an array output
  // stream that can only buffer 1 byte at a time - this prevents the message
  // from ever jumping to the fast path, ensuring that serialization happens via
  // the CodedOutputStream.
  unittest::TestPackedExtensions source;
  unittest::TestPackedTypes destination;
  TestUtil::SetPackedExtensions(&source);
  size_t size = source.ByteSizeLong();
  std::string data;
  data.resize(size);
  {
    io::ArrayOutputStream array_stream(&data[0], size, 1);
    io::CodedOutputStream output_stream(&array_stream);
    source.SerializeWithCachedSizes(&output_stream);
    ASSERT_FALSE(output_stream.HadError());
  }
  EXPECT_TRUE(destination.ParseFromString(data));
  TestUtil::ExpectPackedFieldsSet(destination);
}